

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

data_node_type * __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
split_upwards(Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *this,double key,int stop_propagation_level,
             vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
             *traversal_path,bool reuse_model,model_node_type **new_parent,bool verbose)

{
  int *piVar1;
  longlong *plVar2;
  uint8_t *puVar3;
  pointer pTVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint8_t uVar7;
  short sVar8;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *pAVar9;
  AlexNode<double,_double> *pAVar10;
  _func_int **pp_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  AlexCompare *pAVar17;
  pointer ppAVar18;
  byte bVar19;
  data_node_type *right_leaf;
  ostream *poVar20;
  pointer pTVar21;
  data_node_type *pdVar22;
  data_node_type *pdVar23;
  data_node_type *pdVar24;
  self_type *psVar25;
  long lVar26;
  int iVar27;
  undefined4 uVar28;
  ulong uVar29;
  byte bVar30;
  data_node_type *pdVar31;
  pointer ppAVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  int iVar36;
  undefined7 in_register_00000089;
  int iVar37;
  data_node_type *pdVar38;
  byte bVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 in_XMM4_Qa;
  double dVar55;
  undefined8 in_XMM5_Qb;
  int local_e0;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *local_d0;
  undefined4 local_c4;
  model_node_type *local_c0;
  AlexCompare *local_b8;
  undefined8 local_b0;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *local_a8;
  int local_9c;
  model_node_type **local_98;
  data_node_type *local_90;
  double local_88;
  undefined8 uStack_80;
  data_node_type *local_70;
  vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  to_delete;
  
  local_c4 = (undefined4)CONCAT71(in_register_00000089,verbose);
  local_9c = stop_propagation_level;
  local_98 = new_parent;
  if (stop_propagation_level < this->root_node_->level_) {
    __assert_fail("stop_propagation_level >= root_node_->level_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x728,
                  "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar21 = (traversal_path->
            super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_c0 = pTVar21[-1].node;
  iVar37 = pTVar21[-1].bucketID;
  pAVar9 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
            *)local_c0->children_[iVar37];
  uVar35 = 1 << ((pAVar9->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
  local_b8 = (AlexCompare *)(ulong)uVar35;
  piVar1 = &(this->stats_).num_sideways_splits;
  *piVar1 = *piVar1 + 1;
  iVar37 = iVar37 - iVar37 % (int)uVar35;
  dVar40 = (double)iVar37;
  iVar27 = iVar37 + uVar35;
  plVar2 = &(this->stats_).num_sideways_split_keys;
  *plVar2 = *plVar2 + (long)pAVar9->num_keys_;
  local_88 = (double)(int)uVar35 * 0.5 + dVar40;
  uStack_80 = 0;
  dVar47 = (double)pAVar9->num_right_out_of_bounds_inserts_ / (double)pAVar9->num_inserts_;
  if (dVar47 <= 0.9) {
    local_b0 = (ulong)local_b0._4_4_ << 0x20;
LAB_0010cb56:
    bVar19 = 0;
  }
  else {
    auVar52._8_8_ = 0;
    auVar52._0_8_ = pAVar9->max_key_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (local_c0->super_AlexNode<double,_double>).model_.a_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (local_c0->super_AlexNode<double,_double>).model_.b_;
    auVar5 = vfmadd213sd_fma(auVar49,auVar52,auVar5);
    if ((auVar5._0_8_ < dVar40) || (local_88 <= auVar5._0_8_)) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_88;
      uVar12 = vcmppd_avx512vl(auVar5,auVar14,0xd);
      auVar53._0_8_ = (double)iVar27;
      auVar53._8_8_ = in_XMM4_Qa;
      uVar13 = vcmppd_avx512vl(auVar5,auVar53,1);
      local_b0 = CONCAT44(local_b0._4_4_,(uint)((byte)uVar12 & 3) & (uint)uVar13);
      goto LAB_0010cb56;
    }
    local_b0 = (ulong)local_b0._4_4_ << 0x20;
    bVar19 = 1;
  }
  local_90 = (data_node_type *)CONCAT44(local_90._4_4_,iVar27);
  dVar55 = (double)pAVar9->num_left_out_of_bounds_inserts_ / (double)pAVar9->num_inserts_;
  if (dVar55 <= 0.9) {
    dVar44 = (local_c0->super_AlexNode<double,_double>).model_.a_;
    dVar48 = (local_c0->super_AlexNode<double,_double>).model_.b_;
    bVar39 = 0;
  }
  else {
    dVar44 = (local_c0->super_AlexNode<double,_double>).model_.a_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar44;
    dVar48 = (local_c0->super_AlexNode<double,_double>).model_.b_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar48;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = pAVar9->min_key_;
    auVar5 = vfmadd213sd_fma(auVar54,auVar45,auVar50);
    if ((dVar40 <= auVar5._0_8_) && (auVar5._0_8_ < local_88)) {
      bVar39 = 0;
      bVar30 = 1;
      goto LAB_0010cbf3;
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_88;
    uVar12 = vcmppd_avx512vl(auVar5,auVar15,0xd);
    auVar41._0_8_ = (double)iVar27;
    auVar41._8_8_ = in_XMM5_Qb;
    uVar13 = vcmppd_avx512vl(auVar5,auVar41,1);
    bVar39 = (byte)uVar12 & 3 & (byte)uVar13;
  }
  bVar30 = 0;
LAB_0010cbf3:
  local_d0 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *)((local_88 - dVar48) / dVar44);
  local_a8 = traversal_path;
  iVar27 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           ::lower_bound<double>(pAVar9,(double *)&local_d0);
  local_70 = bulk_load_leaf_node_from_existing
                       (this,pAVar9,0,iVar27,true,(FTNode *)0x0,reuse_model,
                        (bool)(0.9 < dVar47 & bVar19),(bool)(0.9 < dVar55 & bVar30));
  right_leaf = bulk_load_leaf_node_from_existing
                         (this,pAVar9,iVar27,pAVar9->data_capacity_,true,(FTNode *)0x0,reuse_model,
                          (bool)(0.9 < dVar47 & (byte)local_b0),(bool)(0.9 < dVar55 & bVar39));
  pdVar38 = local_70;
  uVar7 = (pAVar9->super_AlexNode<double,_double>).duplication_factor_;
  (local_70->super_AlexNode<double,_double>).duplication_factor_ = uVar7;
  (right_leaf->super_AlexNode<double,_double>).duplication_factor_ = uVar7;
  sVar8 = (pAVar9->super_AlexNode<double,_double>).level_;
  (local_70->super_AlexNode<double,_double>).level_ = sVar8;
  (right_leaf->super_AlexNode<double,_double>).level_ = sVar8;
  link_data_nodes(this,pAVar9,local_70,right_leaf);
  local_d0 = pAVar9;
  std::vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>::
  emplace_back<alex::AlexNode<double,double>*>
            ((vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>
              *)&to_delete,(AlexNode<double,_double> **)&local_d0);
  piVar1 = &(this->stats_).num_data_nodes;
  *piVar1 = *piVar1 + -1;
  if ((char)local_c4 != '\0') {
    poVar20 = std::operator<<((ostream *)&std::cout,"[Splitting upwards data node] level ");
    poVar20 = (ostream *)
              std::ostream::operator<<(poVar20,(pAVar9->super_AlexNode<double,_double>).level_);
    poVar20 = std::operator<<(poVar20,", node addr: ");
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    poVar20 = std::operator<<(poVar20,", node repeats in parent: ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_b8);
    poVar20 = std::operator<<(poVar20,", node indexes in parent: [");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar37);
    poVar20 = std::operator<<(poVar20,", ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_90);
    poVar20 = std::operator<<(poVar20,")");
    poVar20 = std::operator<<(poVar20,", left leaf indexes: [0, ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar27);
    poVar20 = std::operator<<(poVar20,")");
    poVar20 = std::operator<<(poVar20,", right leaf indexes: [");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar27);
    poVar20 = std::operator<<(poVar20,", ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,pAVar9->data_capacity_);
    poVar20 = std::operator<<(poVar20,")");
    poVar20 = std::operator<<(poVar20,", new nodes addr: ");
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    poVar20 = std::operator<<(poVar20,",");
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    std::endl<char,std::char_traits<char>>(poVar20);
  }
  dVar40 = (local_c0->super_AlexNode<double,_double>).model_.a_;
  dVar47 = (local_c0->super_AlexNode<double,_double>).model_.b_;
  pTVar21 = (local_a8->
            super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (AlexCompare *)&this->field_0xc9;
  lVar34 = (long)(int)((ulong)((long)(local_a8->
                                     super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar21) >>
                      4);
  pdVar24 = right_leaf;
  do {
    lVar26 = lVar34 + -1;
    pAVar9 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *)pTVar21[lVar26].node;
    pTVar4 = pTVar21 + lVar26;
    iVar37 = (int)(pAVar9->super_AlexNode<double,_double>).level_;
    local_e0 = (int)lVar34;
    if (iVar37 <= local_9c) {
      if (iVar37 != local_9c) {
        __assert_fail("top_node->level_ == stop_propagation_level",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x846,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      if (local_e0 ==
          (int)((ulong)((long)(local_a8->
                              super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar21) >> 4)) {
        *local_98 = (model_node_type *)pAVar9;
      }
      iVar37 = pTVar4->bucketID;
      bVar19 = (pdVar38->super_AlexNode<double,_double>).duplication_factor_;
      iVar27 = 1 << (bVar19 & 0x1f);
      if ((char)local_c4 != '\0') {
        poVar20 = std::operator<<((ostream *)&std::cout,"[Splitting upwards top node] level ");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_9c);
        poVar20 = std::operator<<(poVar20,", node addr: ");
        poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
        poVar20 = std::operator<<(poVar20,", node children: ");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,*(int *)&pAVar9->allocator_);
        poVar20 = std::operator<<(poVar20,", child index: ");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar37);
        poVar20 = std::operator<<(poVar20,", child repeats in node: ");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar27);
        poVar20 = std::operator<<(poVar20,", node repeats in parent: ");
        poVar20 = (ostream *)
                  std::ostream::operator<<
                            (poVar20,1 << ((pAVar9->super_AlexNode<double,_double>).
                                           duplication_factor_ & 0x1f));
        std::endl<char,std::char_traits<char>>(poVar20);
      }
      if (bVar19 == 0) {
        piVar1 = &(this->stats_).num_model_node_expansions;
        *piVar1 = *piVar1 + 1;
        plVar2 = &(this->stats_).num_model_node_expansion_pointers;
        *plVar2 = *plVar2 + (long)*(int *)&pAVar9->allocator_;
        AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::expand
                  ((AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)
                   pAVar9,1);
        iVar37 = iVar37 * 2;
        iVar27 = 2;
      }
      else {
        puVar3 = &(pdVar38->super_AlexNode<double,_double>).duplication_factor_;
        *puVar3 = *puVar3 + 0xff;
        puVar3 = &(pdVar24->super_AlexNode<double,_double>).duplication_factor_;
        *puVar3 = *puVar3 + 0xff;
      }
      ppAVar18 = to_delete.
                 super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      iVar37 = iVar37 - iVar37 % iVar27;
      lVar34 = (long)(iVar27 / 2 + iVar37);
      for (lVar26 = (long)iVar37; lVar26 < lVar34; lVar26 = lVar26 + 1) {
        (&(pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar26] =
             (_func_int **)pdVar38;
      }
      for (; ppAVar32 = to_delete.
                        super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start, lVar34 < iVar37 + iVar27;
          lVar34 = lVar34 + 1) {
        (&(pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar34] =
             (_func_int **)pdVar24;
      }
      for (; ppAVar32 != ppAVar18; ppAVar32 = ppAVar32 + 1) {
        delete_node(this,*ppAVar32);
      }
      auVar43._8_8_ = 0;
      auVar43._0_8_ = key;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar47;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar40;
      auVar5 = vfmadd132sd_fma(auVar43,auVar46,auVar6);
      if (auVar5._0_8_ < local_88) {
        right_leaf = local_70;
      }
      std::
      _Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
      ::~_Vector_base(&to_delete.
                       super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                     );
      return right_leaf;
    }
    piVar1 = &(this->stats_).num_model_node_splits;
    *piVar1 = *piVar1 + 1;
    iVar37 = *(int *)&pAVar9->allocator_;
    plVar2 = &(this->stats_).num_model_node_split_pointers;
    *plVar2 = *plVar2 + (long)iVar37;
    iVar37 = iVar37 / 2;
    local_c0 = (model_node_type *)CONCAT44(local_c0._4_4_,pTVar4->bucketID);
    local_b0 = lVar26;
    if (pTVar4->bucketID < iVar37) {
      if (1 << (*(byte *)((long)(&(pAVar9->next_leaf_->super_AlexNode<double,_double>).
                                  _vptr_AlexNode)[iVar37] + 9) & 0x1f) == iVar37) {
        pdVar22 = (data_node_type *)operator_new(0x40);
        sVar8 = (pAVar9->super_AlexNode<double,_double>).level_;
        (pdVar22->super_AlexNode<double,_double>).is_leaf_ = false;
        (pdVar22->super_AlexNode<double,_double>).duplication_factor_ = '\0';
        (pdVar22->super_AlexNode<double,_double>).level_ = sVar8;
        (pdVar22->super_AlexNode<double,_double>).model_.a_ = 0.0;
        (pdVar22->super_AlexNode<double,_double>).model_.b_ = 0.0;
        (pdVar22->super_AlexNode<double,_double>).cost_ = 0.0;
        (pdVar22->super_AlexNode<double,_double>)._vptr_AlexNode =
             (_func_int **)&PTR__AlexModelNode_00117c70;
        pdVar22->key_less_ = local_b8;
        *(int *)&pdVar22->allocator_ = 0;
        pdVar22->next_leaf_ = (self_type *)0x0;
        bVar16 = true;
        pdVar31 = pdVar24;
        pdVar24 = (data_node_type *)0x0;
      }
      else {
LAB_0010d005:
        local_90 = pdVar24;
        pdVar22 = (data_node_type *)operator_new(0x40);
        pAVar17 = local_b8;
        sVar8 = (pAVar9->super_AlexNode<double,_double>).level_;
        (pdVar22->super_AlexNode<double,_double>).is_leaf_ = false;
        (pdVar22->super_AlexNode<double,_double>).duplication_factor_ = '\0';
        (pdVar22->super_AlexNode<double,_double>).level_ = sVar8;
        (pdVar22->super_AlexNode<double,_double>).model_.a_ = 0.0;
        (pdVar22->super_AlexNode<double,_double>).model_.b_ = 0.0;
        (pdVar22->super_AlexNode<double,_double>).cost_ = 0.0;
        (pdVar22->super_AlexNode<double,_double>)._vptr_AlexNode =
             (_func_int **)&PTR__AlexModelNode_00117c70;
        pdVar22->key_less_ = local_b8;
        *(int *)&pdVar22->allocator_ = 0;
        pdVar22->next_leaf_ = (self_type *)0x0;
        pdVar24 = (data_node_type *)operator_new(0x40);
        sVar8 = (pAVar9->super_AlexNode<double,_double>).level_;
        (pdVar24->super_AlexNode<double,_double>).is_leaf_ = false;
        (pdVar24->super_AlexNode<double,_double>).duplication_factor_ = '\0';
        (pdVar24->super_AlexNode<double,_double>).cost_ = 0.0;
        *(undefined4 *)&pdVar24->allocator_ = 0;
        pdVar24->next_leaf_ = (self_type *)0x0;
        bVar16 = false;
        (pdVar24->super_AlexNode<double,_double>).level_ = sVar8;
        (pdVar24->super_AlexNode<double,_double>).model_.a_ = 0.0;
        (pdVar24->super_AlexNode<double,_double>).model_.b_ = 0.0;
        (pdVar24->super_AlexNode<double,_double>)._vptr_AlexNode =
             (_func_int **)&PTR__AlexModelNode_00117c70;
        pdVar24->key_less_ = pAVar17;
        uVar28 = 0;
        pdVar31 = local_90;
        if (iVar37 <= (int)local_c0) goto LAB_0010d148;
      }
      if (local_e0 ==
          (int)((ulong)((long)(local_a8->
                              super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_a8->
                             super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        *local_98 = (model_node_type *)pdVar22;
      }
      iVar37 = *(int *)&pAVar9->allocator_;
      *(int *)&pdVar22->allocator_ = iVar37;
      psVar25 = (self_type *)
                __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                          ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_d0,(long)iVar37
                           ,(void *)0x0);
      pdVar22->next_leaf_ = psVar25;
      dVar55 = (pAVar9->super_AlexNode<double,_double>).model_.a_;
      dVar44 = (pAVar9->super_AlexNode<double,_double>).model_.b_;
      (pdVar22->super_AlexNode<double,_double>).model_.a_ = dVar55 + dVar55;
      (pdVar22->super_AlexNode<double,_double>).model_.b_ = dVar44 + dVar44;
      iVar27 = *(int *)&pAVar9->allocator_ / 2;
      iVar37 = 0;
      while (iVar37 < iVar27) {
        pAVar10 = (AlexNode<double,_double> *)
                  (&(pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[iVar37];
        bVar19 = pAVar10->duplication_factor_;
        iVar33 = (1 << (bVar19 & 0x1f)) + iVar37;
        for (lVar34 = (long)(iVar37 * 2); lVar34 < iVar33 * 2; lVar34 = lVar34 + 1) {
          (&(pdVar22->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar34] =
               (_func_int **)pAVar10;
        }
        pAVar10->duplication_factor_ = bVar19 + 1;
        iVar37 = iVar33;
      }
      if (iVar37 != iVar27) {
        __assert_fail("cur == cur_node->num_children_ / 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x7c6,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      if (bVar16) {
        pdVar24 = (data_node_type *)
                  (&(pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[iVar27];
        (pdVar24->super_AlexNode<double,_double>).level_ =
             (pAVar9->super_AlexNode<double,_double>).level_;
      }
      else {
        *(int *)&pdVar24->allocator_ = iVar27;
        psVar25 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                            ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_d0,
                             (long)iVar27,(void *)0x0);
        pdVar24->next_leaf_ = psVar25;
        (pdVar24->super_AlexNode<double,_double>).model_.a_ =
             (pAVar9->super_AlexNode<double,_double>).model_.a_;
        iVar37 = *(int *)&pAVar9->allocator_;
        iVar27 = iVar37 / 2;
        (pdVar24->super_AlexNode<double,_double>).model_.b_ =
             (pAVar9->super_AlexNode<double,_double>).model_.b_ - (double)iVar27;
        for (lVar34 = 0; iVar27 + lVar34 < (long)iVar37; lVar34 = lVar34 + 1) {
          (&(pdVar24->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar34] =
               (&(pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)
               [iVar27 + lVar34];
        }
      }
      uVar29 = (long)pTVar4->bucketID * 2;
      iVar27 = 2 << ((pdVar38->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
      lVar26 = uVar29 - (long)(int)((long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 |
                                          uVar29 & 0xffffffff) % (long)iVar27);
      iVar37 = (int)lVar26;
      lVar34 = (long)((iVar27 >> 1) + iVar37);
      for (; lVar26 < lVar34; lVar26 = lVar26 + 1) {
        (&(pdVar22->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar26] =
             (_func_int **)pdVar38;
      }
      for (; lVar34 < iVar27 + iVar37; lVar34 = lVar34 + 1) {
        (&(pdVar22->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar34] =
             (_func_int **)pdVar31;
      }
      local_c0 = (model_node_type *)((ulong)local_c0 & 0xffffffff00000000);
    }
    else {
      if (1 << (*(byte *)((long)(pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode
                         + 9) & 0x1f) != iVar37) goto LAB_0010d005;
      pdVar23 = (data_node_type *)operator_new(0x40);
      sVar8 = (pAVar9->super_AlexNode<double,_double>).level_;
      (pdVar23->super_AlexNode<double,_double>).is_leaf_ = false;
      (pdVar23->super_AlexNode<double,_double>).duplication_factor_ = '\0';
      pdVar22 = (data_node_type *)0x0;
      (pdVar23->super_AlexNode<double,_double>).level_ = sVar8;
      (pdVar23->super_AlexNode<double,_double>).model_.a_ = 0.0;
      (pdVar23->super_AlexNode<double,_double>).model_.b_ = 0.0;
      (pdVar23->super_AlexNode<double,_double>).cost_ = 0.0;
      (pdVar23->super_AlexNode<double,_double>)._vptr_AlexNode =
           (_func_int **)&PTR__AlexModelNode_00117c70;
      pdVar23->key_less_ = local_b8;
      *(undefined4 *)&pdVar23->allocator_ = 0;
      pdVar23->next_leaf_ = (self_type *)0x0;
      uVar28 = (undefined4)CONCAT71((uint7)(byte)((ushort)sVar8 >> 8),1);
      pdVar31 = pdVar24;
      pdVar24 = pdVar23;
LAB_0010d148:
      if (local_e0 ==
          (int)((ulong)((long)(local_a8->
                              super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_a8->
                             super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        *local_98 = (model_node_type *)pdVar24;
      }
      local_c0 = (model_node_type *)CONCAT44(local_c0._4_4_,uVar28);
      if ((char)uVar28 == '\0') {
        iVar37 = *(int *)&pAVar9->allocator_ / 2;
        *(int *)&pdVar22->allocator_ = iVar37;
        psVar25 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                            ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_d0,
                             (long)iVar37,(void *)0x0);
        pdVar22->next_leaf_ = psVar25;
        dVar55 = (pAVar9->super_AlexNode<double,_double>).model_.b_;
        (pdVar22->super_AlexNode<double,_double>).model_.a_ =
             (pAVar9->super_AlexNode<double,_double>).model_.a_;
        (pdVar22->super_AlexNode<double,_double>).model_.b_ = dVar55;
        iVar37 = *(int *)&pAVar9->allocator_;
        for (uVar29 = 0; (uint)(~(iVar37 / 2 >> 0x1f) & iVar37 / 2) != uVar29; uVar29 = uVar29 + 1)
        {
          (&(pdVar22->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[uVar29] =
               (_func_int **)
               (&(pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[uVar29];
        }
      }
      else {
        pdVar22 = (data_node_type *)
                  (pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode;
        (pdVar22->super_AlexNode<double,_double>).level_ =
             (pAVar9->super_AlexNode<double,_double>).level_;
        iVar37 = *(int *)&pAVar9->allocator_;
      }
      *(int *)&pdVar24->allocator_ = iVar37;
      psVar25 = (self_type *)
                __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                          ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_d0,(long)iVar37
                           ,(void *)0x0);
      pdVar24->next_leaf_ = psVar25;
      iVar37 = *(int *)&pAVar9->allocator_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = (pAVar9->super_AlexNode<double,_double>).model_.a_;
      uVar29 = (long)iVar37 / 2 & 0xffffffff;
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           (pAVar9->super_AlexNode<double,_double>).model_.b_ - (double)(int)((long)iVar37 / 2);
      auVar5 = vunpcklpd_avx(auVar51,auVar42);
      (pdVar24->super_AlexNode<double,_double>).model_.a_ = auVar5._0_8_ + auVar5._0_8_;
      (pdVar24->super_AlexNode<double,_double>).model_.b_ = auVar5._8_8_ + auVar5._8_8_;
      while( true ) {
        iVar27 = (int)uVar29;
        if (iVar37 <= iVar27) break;
        pp_Var11 = (&(pAVar9->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[iVar27];
        bVar19 = *(byte *)((long)pp_Var11 + 9);
        iVar33 = 1 << (bVar19 & 0x1f);
        iVar36 = iVar27 + iVar37 / -2;
        for (lVar34 = (long)(iVar36 * 2); lVar34 < (iVar33 + iVar36) * 2; lVar34 = lVar34 + 1) {
          (&(pdVar24->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar34] = pp_Var11
          ;
        }
        *(byte *)((long)pp_Var11 + 9) = bVar19 + 1;
        uVar29 = (ulong)(uint)(iVar33 + iVar27);
      }
      if (iVar27 != iVar37) {
        __assert_fail("cur == cur_node->num_children_",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x816,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      iVar37 = (pTVar4->bucketID + iVar37 / -2) * 2;
      iVar27 = 2 << ((pdVar38->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
      iVar37 = iVar37 - iVar37 % iVar27;
      lVar34 = (long)((iVar27 >> 1) + iVar37);
      for (lVar26 = (long)iVar37; lVar26 < lVar34; lVar26 = lVar26 + 1) {
        (&(pdVar24->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar26] =
             (_func_int **)pdVar38;
      }
      for (; lVar34 < iVar37 + iVar27; lVar34 = lVar34 + 1) {
        (&(pdVar24->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar34] =
             (_func_int **)pdVar31;
      }
      bVar16 = false;
    }
    if ((pdVar24 == (data_node_type *)0x0) || (pdVar22 == (data_node_type *)0x0)) {
      __assert_fail("next_left_split != nullptr && next_right_split != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                    ,0x829,
                    "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                   );
    }
    if ((char)local_c4 != '\0') {
      poVar20 = std::operator<<((ostream *)&std::cout,"[Splitting upwards through-node] level ");
      poVar20 = (ostream *)
                std::ostream::operator<<(poVar20,(pAVar9->super_AlexNode<double,_double>).level_);
      poVar20 = std::operator<<(poVar20,", node addr: ");
      poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
      poVar20 = std::operator<<(poVar20,", node children: ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,pTVar4->node->num_children_);
      poVar20 = std::operator<<(poVar20,", child index: ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,pTVar4->bucketID);
      poVar20 = std::operator<<(poVar20,", child repeats in node: ");
      poVar20 = (ostream *)
                std::ostream::operator<<
                          (poVar20,1 << ((pdVar38->super_AlexNode<double,_double>).
                                         duplication_factor_ & 0x1f));
      poVar20 = std::operator<<(poVar20,", node repeats in parent: ");
      poVar20 = (ostream *)
                std::ostream::operator<<
                          (poVar20,1 << ((pTVar4->node->super_AlexNode<double,_double>).
                                         duplication_factor_ & 0x1f));
      poVar20 = std::operator<<(poVar20,", new nodes addr: ");
      poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
      poVar20 = std::operator<<(poVar20,",");
      poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
      std::endl<char,std::char_traits<char>>(poVar20);
    }
    local_d0 = pAVar9;
    std::vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>::
    emplace_back<alex::AlexNode<double,double>*>
              ((vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>
                *)&to_delete,(AlexNode<double,_double> **)&local_d0);
    if ((char)local_c0 == '\0' && !bVar16) {
      piVar1 = &(this->stats_).num_model_nodes;
      *piVar1 = *piVar1 + 1;
    }
    uVar7 = (pAVar9->super_AlexNode<double,_double>).duplication_factor_;
    (pdVar22->super_AlexNode<double,_double>).duplication_factor_ = uVar7;
    (pdVar24->super_AlexNode<double,_double>).duplication_factor_ = uVar7;
    pTVar21 = (local_a8->
              super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar34 = local_b0;
    pdVar38 = pdVar22;
  } while( true );
}

Assistant:

data_node_type* split_upwards(
      T key, int stop_propagation_level,
      const std::vector<TraversalNode>& traversal_path, bool reuse_model,
      model_node_type** new_parent, bool verbose = false) {
    assert(stop_propagation_level >= root_node_->level_);
    std::vector<AlexNode<T, P>*> to_delete;  // nodes that need to be deleted

    // Split the data node into two new data nodes
    const TraversalNode& parent_path_node = traversal_path.back();
    model_node_type* parent = parent_path_node.node;
    auto leaf = static_cast<data_node_type*>(
        parent->children_[parent_path_node.bucketID]);
    int leaf_repeats = 1 << (leaf->duplication_factor_);
    int leaf_start_bucketID =
        parent_path_node.bucketID - (parent_path_node.bucketID % leaf_repeats);
    double leaf_mid_bucketID = leaf_start_bucketID + leaf_repeats / 2.0;
    int leaf_end_bucketID =
        leaf_start_bucketID + leaf_repeats;  // first bucket with next child
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    // Determine if either of the two new data nodes will need to adapt to
    // append-mostly behavior
    bool append_mostly_right = leaf->is_append_mostly_right();
    bool left_half_appending_right = false, right_half_appending_right = false;
    if (append_mostly_right) {
      double appending_right_bucketID =
          parent->model_.predict_double(leaf->max_key_);
      if (appending_right_bucketID >= leaf_start_bucketID &&
          appending_right_bucketID < leaf_mid_bucketID) {
        left_half_appending_right = true;
      } else if (appending_right_bucketID >= leaf_mid_bucketID &&
                 appending_right_bucketID < leaf_end_bucketID) {
        right_half_appending_right = true;
      }
    }
    bool append_mostly_left = leaf->is_append_mostly_left();
    bool left_half_appending_left = false, right_half_appending_left = false;
    if (append_mostly_left) {
      double appending_left_bucketID =
          parent->model_.predict_double(leaf->min_key_);
      if (appending_left_bucketID >= leaf_start_bucketID &&
          appending_left_bucketID < leaf_mid_bucketID) {
        left_half_appending_left = true;
      } else if (appending_left_bucketID >= leaf_mid_bucketID &&
                 appending_left_bucketID < leaf_end_bucketID) {
        right_half_appending_left = true;
      }
    }

    int mid_boundary = leaf->lower_bound(
        (leaf_mid_bucketID - parent->model_.b_) / parent->model_.a_);
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        leaf, 0, mid_boundary, true, nullptr, reuse_model,
        append_mostly_right && left_half_appending_right,
        append_mostly_left && left_half_appending_left);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        leaf, mid_boundary, leaf->data_capacity_, true, nullptr, reuse_model,
        append_mostly_right && right_half_appending_right,
        append_mostly_left && right_half_appending_left);
    // This is the expected duplication factor; it will be correct once we
    // split/expand the parent
    left_leaf->duplication_factor_ = leaf->duplication_factor_;
    right_leaf->duplication_factor_ = leaf->duplication_factor_;
    left_leaf->level_ = leaf->level_;
    right_leaf->level_ = leaf->level_;
    link_data_nodes(leaf, left_leaf, right_leaf);
    to_delete.push_back(leaf);
    stats_.num_data_nodes--;

    if (verbose) {
      std::cout << "[Splitting upwards data node] level " << leaf->level_
                << ", node addr: " << leaf
                << ", node repeats in parent: " << leaf_repeats
                << ", node indexes in parent: [" << leaf_start_bucketID << ", "
                << leaf_end_bucketID << ")"
                << ", left leaf indexes: [0, " << mid_boundary << ")"
                << ", right leaf indexes: [" << mid_boundary << ", "
                << leaf->data_capacity_ << ")"
                << ", new nodes addr: " << left_leaf << "," << right_leaf
                << std::endl;
    }

    // The new data node that the key falls into is the one we return
    data_node_type* new_data_node;
    if (parent->model_.predict_double(key) < leaf_mid_bucketID) {
      new_data_node = left_leaf;
    } else {
      new_data_node = right_leaf;
    }

    // Split all internal nodes from the parent up to the highest node along the
    // traversal path.
    // As this happens, the entries of the traversal path will go stale, which
    // is fine because we no longer use them.
    // Splitting an internal node involves dividing the child pointers into two
    // halves, and doubling the relevant half.
    AlexNode<T, P>* prev_left_split = left_leaf;
    AlexNode<T, P>* prev_right_split = right_leaf;
    int path_idx = static_cast<int>(traversal_path.size()) - 1;
    while (traversal_path[path_idx].node->level_ > stop_propagation_level) {
      // Decide which half to double
      const TraversalNode& path_node = traversal_path[path_idx];
      model_node_type* cur_node = path_node.node;
      stats_.num_model_node_splits++;
      stats_.num_model_node_split_pointers += cur_node->num_children_;
      bool double_left_half = path_node.bucketID < cur_node->num_children_ / 2;
      model_node_type* left_split = nullptr;
      model_node_type* right_split = nullptr;

      // If one of the resulting halves will only have one child pointer, we
      // should "pull up" that child
      bool pull_up_left_child = false, pull_up_right_child = false;
      AlexNode<T, P>* left_half_first_child = cur_node->children_[0];
      AlexNode<T, P>* right_half_first_child =
          cur_node->children_[cur_node->num_children_ / 2];
      if (double_left_half &&
          (1 << right_half_first_child->duplication_factor_) ==
              cur_node->num_children_ / 2) {
        // pull up right child if all children in the right half are the same
        pull_up_right_child = true;
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else if (!double_left_half &&
                 (1 << left_half_first_child->duplication_factor_) ==
                     cur_node->num_children_ / 2) {
        // pull up left child if all children in the left half are the same
        pull_up_left_child = true;
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else {
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      }

      // Do the split
      AlexNode<T, P>* next_left_split = nullptr;
      AlexNode<T, P>* next_right_split = nullptr;
      if (double_left_half) {
        // double left half
        assert(left_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = left_split;
        }
        left_split->num_children_ = cur_node->num_children_;
        left_split->children_ =
            new (pointer_allocator().allocate(left_split->num_children_))
                AlexNode<T, P>*[left_split->num_children_];
        left_split->model_.a_ = cur_node->model_.a_ * 2;
        left_split->model_.b_ = cur_node->model_.b_ * 2;
        int cur = 0;
        while (cur < cur_node->num_children_ / 2) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          for (int i = 2 * cur; i < 2 * (cur + cur_child_repeats); i++) {
            left_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_ / 2);

        if (pull_up_right_child) {
          next_right_split = cur_node->children_[cur_node->num_children_ / 2];
          next_right_split->level_ = cur_node->level_;
        } else {
          right_split->num_children_ = cur_node->num_children_ / 2;
          right_split->children_ =
              new (pointer_allocator().allocate(right_split->num_children_))
                  AlexNode<T, P>*[right_split->num_children_];
          right_split->model_.a_ = cur_node->model_.a_;
          right_split->model_.b_ =
              cur_node->model_.b_ - cur_node->num_children_ / 2;
          int j = 0;
          for (int i = cur_node->num_children_ / 2; i < cur_node->num_children_;
               i++) {
            right_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_right_split = right_split;
        }

        int new_bucketID = path_node.bucketID * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          left_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          left_split->children_[i] = prev_right_split;
        }
        next_left_split = left_split;
      } else {
        // double right half
        assert(right_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = right_split;
        }
        if (pull_up_left_child) {
          next_left_split = cur_node->children_[0];
          next_left_split->level_ = cur_node->level_;
        } else {
          left_split->num_children_ = cur_node->num_children_ / 2;
          left_split->children_ =
              new (pointer_allocator().allocate(left_split->num_children_))
                  AlexNode<T, P>*[left_split->num_children_];
          left_split->model_.a_ = cur_node->model_.a_;
          left_split->model_.b_ = cur_node->model_.b_;
          int j = 0;
          for (int i = 0; i < cur_node->num_children_ / 2; i++) {
            left_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_left_split = left_split;
        }

        right_split->num_children_ = cur_node->num_children_;
        right_split->children_ =
            new (pointer_allocator().allocate(right_split->num_children_))
                AlexNode<T, P>*[right_split->num_children_];
        right_split->model_.a_ = cur_node->model_.a_ * 2;
        right_split->model_.b_ =
            (cur_node->model_.b_ - cur_node->num_children_ / 2) * 2;
        int cur = cur_node->num_children_ / 2;
        while (cur < cur_node->num_children_) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          int right_child_idx = cur - cur_node->num_children_ / 2;
          for (int i = 2 * right_child_idx;
               i < 2 * (right_child_idx + cur_child_repeats); i++) {
            right_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_);

        int new_bucketID =
            (path_node.bucketID - cur_node->num_children_ / 2) * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          right_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          right_split->children_[i] = prev_right_split;
        }
        next_right_split = right_split;
      }
      assert(next_left_split != nullptr && next_right_split != nullptr);
      if (verbose) {
        std::cout << "[Splitting upwards through-node] level "
                  << cur_node->level_ << ", node addr: " << path_node.node
                  << ", node children: " << path_node.node->num_children_
                  << ", child index: " << path_node.bucketID
                  << ", child repeats in node: "
                  << (1 << prev_left_split->duplication_factor_)
                  << ", node repeats in parent: "
                  << (1 << path_node.node->duplication_factor_)
                  << ", new nodes addr: " << left_split << "," << right_split
                  << std::endl;
      }
      to_delete.push_back(cur_node);
      if (!pull_up_left_child && !pull_up_right_child) {
        stats_.num_model_nodes++;
      }
      // This is the expected duplication factor; it will be correct once we
      // split/expand the parent
      next_left_split->duplication_factor_ = cur_node->duplication_factor_;
      next_right_split->duplication_factor_ = cur_node->duplication_factor_;
      prev_left_split = next_left_split;
      prev_right_split = next_right_split;
      path_idx--;
    }

    // Insert into the top node
    const TraversalNode& top_path_node = traversal_path[path_idx];
    model_node_type* top_node = top_path_node.node;
    assert(top_node->level_ == stop_propagation_level);
    if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
      *new_parent = top_node;
    }
    int top_bucketID = top_path_node.bucketID;
    int repeats =
        1 << prev_left_split->duplication_factor_;  // this was the duplication
                                                    // factor of the child that
                                                    // was deleted
    if (verbose) {
      std::cout << "[Splitting upwards top node] level "
                << stop_propagation_level << ", node addr: " << top_node
                << ", node children: " << top_node->num_children_
                << ", child index: " << top_bucketID
                << ", child repeats in node: " << repeats
                << ", node repeats in parent: "
                << (1 << top_node->duplication_factor_) << std::endl;
    }

    // Expand the top node if necessary
    if (repeats == 1) {
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += top_node->num_children_;
      top_node->expand(1);  // double size of top node
      top_bucketID *= 2;
      repeats *= 2;
    } else {
      prev_left_split->duplication_factor_--;
      prev_right_split->duplication_factor_--;
    }

    int start_bucketID =
        top_bucketID -
        (top_bucketID % repeats);  // first bucket with same child
    int mid_bucketID = start_bucketID + repeats / 2;
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with next child
    for (int i = start_bucketID; i < mid_bucketID; i++) {
      top_node->children_[i] = prev_left_split;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      top_node->children_[i] = prev_right_split;
    }

    for (auto node : to_delete) {
      delete_node(node);
    }

    return new_data_node;
  }